

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShadowValue.cpp
# Opt level: O2

string * __thiscall
ShadowValue::getCSVformat_abi_cxx11_(string *__return_storage_ptr__,ShadowValue *this)

{
  string sStack_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  std::__cxx11::to_string(&local_38,this->__index);
  std::operator+(&local_198,&local_38," ");
  std::__cxx11::to_string(&local_1b8,this->__argument);
  std::operator+(&local_178,&local_198,&local_1b8);
  std::operator+(&local_158,&local_178," ");
  std::__cxx11::to_string(&local_1d8,this->__doubleP);
  std::operator+(&local_138,&local_158,&local_1d8);
  std::operator+(&local_118,&local_138," ");
  std::__cxx11::to_string(&local_1f8,this->__singleP);
  std::operator+(&local_f8,&local_118,&local_1f8);
  std::operator+(&local_d8,&local_f8," ");
  std::__cxx11::to_string(&local_218,ABS(this->__doubleP - this->__singleP));
  std::operator+(&local_b8,&local_d8,&local_218);
  std::operator+(&local_98,&local_b8," ");
  std::__cxx11::to_string(&local_238,ABS(this->__doubleP - this->__singleP) / this->__doubleP);
  std::operator+(&local_78,&local_98,&local_238);
  std::operator+(&local_58,&local_78," ");
  std::__cxx11::to_string(&sStack_258,(uint)this->__spBoolean);
  std::operator+(__return_storage_ptr__,&local_58,&sStack_258);
  std::__cxx11::string::~string((string *)&sStack_258);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string ShadowValue::getCSVformat(){
    return to_string(__index) + " "
#ifdef USE_TIMESTAMP
        + to_string(__timeStamp) + " "
#endif
        + to_string(__argument) + " "
        + to_string(__doubleP) + " "
        + to_string(__singleP) + " "
        + to_string(abs(__doubleP - __singleP)) + " "
        + to_string(abs(__doubleP - __singleP)/__doubleP) + " "
        + to_string(__spBoolean);
}